

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-affinity.c
# Opt level: O0

int run_test_thread_affinity(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *__s;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t threads [3];
  int i;
  int c;
  int r;
  int ncpus;
  char *cpumask;
  int cpumasksize;
  int t2second;
  int t2first;
  int t1second;
  int t1first;
  
  eval_a = uv_thread_self();
  iVar1 = uv_cpumask_size();
  if ((long)iVar1 < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x42,"cpumasksize",">","0",(long)iVar1,">",0);
    abort();
  }
  __s = (char *)calloc((long)(iVar1 << 2),1);
  if (__s == (char *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x45,"cpumask");
    abort();
  }
  iVar2 = uv_thread_getaffinity(&eval_a,__s,(long)iVar1);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x48,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  if (*__s == '\0') {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x49,"cpumask[0] && \"test must be run with cpu 0 affinity\"");
    abort();
  }
  c = 0;
  do {
    c = c + 1;
  } while (__s[c] != '\0');
  memset(__s,0,(long)(iVar1 << 2));
  iVar2 = iVar1 * 2;
  __s[iVar1] = '\x01';
  __s[iVar2] = '\x01';
  __s[(int)(uint)(1 < c)] = '\x01';
  __s[(int)(iVar1 * 3 + (uint)(1 < c))] = '\x01';
  __s[iVar1 + 2] = '\x01';
  __s[iVar2 + 2] = '\x01';
  __s[3] = '\x01';
  __s[iVar1 * 3 + 3] = '\x01';
  iVar3 = uv_thread_create(threads,check_affinity,__s);
  if ((long)iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x69,"uv_thread_create(threads + 1, check_affinity, &cpumask[t1first])","==","0",
            (long)iVar3,"==",0);
    abort();
  }
  iVar3 = uv_thread_create(threads + 1,check_affinity,__s + iVar2);
  if ((long)iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x6c,"uv_thread_create(threads + 2, check_affinity, &cpumask[t2first])","==","0",
            (long)iVar3,"==",0);
    abort();
  }
  iVar3 = uv_thread_join(threads);
  if ((long)iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x6d,"uv_thread_join(threads + 1)","==","0",(long)iVar3,"==",0);
    abort();
  }
  iVar3 = uv_thread_join(threads + 1);
  if ((long)iVar3 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x6e,"uv_thread_join(threads + 2)","==","0",(long)iVar3,"==",0);
    abort();
  }
  if ((int)*__s != (uint)(c == 1)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x70,"cpumask[t1first + 0] == (ncpus == 1)");
    abort();
  }
  if ((int)__s[1] != (uint)(1 < c)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x71,"cpumask[t1first + 1] == (ncpus >= 2)");
    abort();
  }
  if ((long)__s[2] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x72,"cpumask[t1first + 2]","==","0",(long)__s[2],"==",0);
    abort();
  }
  if ((int)__s[3] != (uint)(3 < c)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x73,"cpumask[t1first + 3] == (ncpus >= 4)");
    abort();
  }
  if ((long)__s[iVar2] != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x75,"1","==","cpumask[t2first + 0]",1,"==",(long)__s[iVar2]);
    abort();
  }
  if ((long)__s[iVar2 + 1] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x76,"cpumask[t2first + 1]","==","0",(long)__s[iVar2 + 1],"==",0);
    abort();
  }
  if ((int)__s[iVar2 + 2] != (uint)(2 < c)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x77,"cpumask[t2first + 2] == (ncpus >= 3)");
    abort();
  }
  if ((long)__s[iVar2 + 3] != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x78,"cpumask[t2first + 3]","==","0",(long)__s[iVar2 + 3],"==",0);
    abort();
  }
  threads[2]._4_4_ = uv_thread_getcpu();
  if ((long)threads[2]._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x7b,"c",">=","0",(long)threads[2]._4_4_,">=",0);
    abort();
  }
  memset(__s,0,(long)iVar1);
  __s[threads[2]._4_4_] = '\x01';
  iVar2 = uv_thread_setaffinity(&eval_a,__s,0,(long)iVar1);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x80,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  memset(__s,0,(long)iVar1);
  iVar2 = uv_thread_getaffinity(&eval_a,__s,(long)iVar1);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
            ,0x84,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  threads[2]._0_4_ = 0;
  do {
    if (iVar1 <= (int)threads[2]) {
      free(__s);
      return 0;
    }
    if ((int)threads[2] == threads[2]._4_4_) {
      if ((long)__s[(int)threads[2]] != 1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
                ,0x87,"1","==","cpumask[i]",1,"==",(long)__s[(int)threads[2]]);
        abort();
      }
    }
    else if ((long)__s[(int)threads[2]] != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
              ,0x89,"cpumask[i]","==","0",(long)__s[(int)threads[2]],"==",0);
      abort();
    }
    threads[2]._0_4_ = (int)threads[2] + 1;
  } while( true );
}

Assistant:

TEST_IMPL(thread_affinity) {
  int t1first;
  int t1second;
  int t2first;
  int t2second;
  int cpumasksize;
  char* cpumask;
  int ncpus;
  int r;
  int c;
  int i;
  uv_thread_t threads[3];

#ifdef _WIN32
  /* uv_thread_self isn't defined for the main thread on Windows */
  threads[0] = GetCurrentThread();
#else
  threads[0] = uv_thread_self();
#endif
  cpumasksize = uv_cpumask_size();
  ASSERT_GT(cpumasksize, 0);

  cpumask = calloc(4 * cpumasksize, 1);
  ASSERT(cpumask);

  r = uv_thread_getaffinity(&threads[0], cpumask, cpumasksize);
  ASSERT_OK(r);
  ASSERT(cpumask[0] && "test must be run with cpu 0 affinity");
  ncpus = 0;
  while (cpumask[++ncpus]) { }
  memset(cpumask, 0, 4 * cpumasksize);

  t1first = cpumasksize * 0;
  t1second = cpumasksize * 1;
  t2first = cpumasksize * 2;
  t2second = cpumasksize * 3;

  cpumask[t1second + 0] = 1;
  cpumask[t2first + 0] = 1;
  cpumask[t1first + (ncpus >= 2)] = 1;
  cpumask[t2second + (ncpus >= 2)] = 1;
#ifdef __linux__
  cpumask[t1second + 2] = 1;
  cpumask[t2first + 2] = 1;
  cpumask[t1first + 3] = 1;
  cpumask[t2second + 3] = 1;
#else
  if (ncpus >= 3) {
    cpumask[t1second + 2] = 1;
    cpumask[t2first + 2] = 1;
  }
  if (ncpus >= 4) {
    cpumask[t1first + 3] = 1;
    cpumask[t2second + 3] = 1;
  }
#endif

  ASSERT_OK(uv_thread_create(threads + 1,
                             check_affinity,
                             &cpumask[t1first]));
  ASSERT_OK(uv_thread_create(threads + 2,
                             check_affinity,
                             &cpumask[t2first]));
  ASSERT_OK(uv_thread_join(threads + 1));
  ASSERT_OK(uv_thread_join(threads + 2));

  ASSERT(cpumask[t1first + 0] == (ncpus == 1));
  ASSERT(cpumask[t1first + 1] == (ncpus >= 2));
  ASSERT_OK(cpumask[t1first + 2]);
  ASSERT(cpumask[t1first + 3] == (ncpus >= 4));

  ASSERT_EQ(1, cpumask[t2first + 0]);
  ASSERT_OK(cpumask[t2first + 1]);
  ASSERT(cpumask[t2first + 2] == (ncpus >= 3));
  ASSERT_OK(cpumask[t2first + 3]);

  c = uv_thread_getcpu();
  ASSERT_GE(c, 0);

  memset(cpumask, 0, cpumasksize);
  cpumask[c] = 1;
  r = uv_thread_setaffinity(&threads[0], cpumask, NULL, cpumasksize);
  ASSERT_OK(r);

  memset(cpumask, 0, cpumasksize);
  r = uv_thread_getaffinity(&threads[0], cpumask, cpumasksize);
  ASSERT_OK(r);
  for (i = 0; i < cpumasksize; i++) {
    if (i == c)
      ASSERT_EQ(1, cpumask[i]);
    else
      ASSERT_OK(cpumask[i]);
  }

  free(cpumask);

  return 0;
}